

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_sqsub_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uintptr_t opr_sz;
  uintptr_t max_sz;
  uint32_t *qc;
  int64_t dd;
  int64_t mm;
  int64_t nn;
  _Bool q;
  int64_t *m;
  int64_t *n;
  int64_t *d;
  intptr_t oprsz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vq_local;
  void *vd_local;
  
  opr_sz = simd_oprsz(desc);
  bVar3 = false;
  for (oprsz = 0; oprsz < (long)opr_sz / 8; oprsz = oprsz + 1) {
    uVar1 = *(ulong *)((long)vn + oprsz * 8);
    uVar2 = *(ulong *)((long)vm + oprsz * 8);
    qc = (uint32_t *)(uVar1 - uVar2);
    if ((((ulong)qc ^ uVar1) & (uVar1 ^ uVar2) & 0x8000000000000000) != 0) {
      qc = (uint32_t *)((long)uVar1 >> 0x3f ^ 0x7fffffffffffffff);
      bVar3 = true;
    }
    *(uint32_t **)((long)vd + oprsz * 8) = qc;
  }
  if (bVar3) {
    *(undefined4 *)vq = 1;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz,max_sz);
  return;
}

Assistant:

void HELPER(gvec_sqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (((dd ^ nn) & (nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}